

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *
remap_pls(vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
          *__return_storage_ptr__,SmallVector<PLSArg,_8UL> *pls_variables,
         SmallVector<spirv_cross::Resource,_8UL> *resources,
         SmallVector<spirv_cross::Resource,_8UL> *secondary_resources)

{
  FILE *__stream;
  __type _Var1;
  undefined8 uVar2;
  value_type local_b8;
  Resource *local_b0;
  Resource *res_1;
  Resource *__end3;
  Resource *__begin3;
  SmallVector<spirv_cross::Resource,_8UL> *__range3;
  value_type local_80;
  Resource *local_78;
  Resource *res;
  Resource *__end2;
  Resource *__begin2;
  SmallVector<spirv_cross::Resource,_8UL> *__range2;
  PLSArg *pPStack_50;
  bool found;
  PLSArg *pls;
  PLSArg *__end1;
  PLSArg *__begin1;
  SmallVector<PLSArg,_8UL> *__range1;
  SmallVector<spirv_cross::Resource,_8UL> *local_28;
  SmallVector<spirv_cross::Resource,_8UL> *secondary_resources_local;
  SmallVector<spirv_cross::Resource,_8UL> *resources_local;
  SmallVector<PLSArg,_8UL> *pls_variables_local;
  vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *ret;
  
  __range1._7_1_ = 0;
  local_28 = secondary_resources;
  secondary_resources_local = resources;
  resources_local = (SmallVector<spirv_cross::Resource,_8UL> *)pls_variables;
  pls_variables_local = (SmallVector<PLSArg,_8UL> *)__return_storage_ptr__;
  std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::vector
            (__return_storage_ptr__);
  __begin1 = (PLSArg *)resources_local;
  __end1 = spirv_cross::VectorView<PLSArg>::begin((VectorView<PLSArg> *)resources_local);
  pls = spirv_cross::VectorView<PLSArg>::end((VectorView<PLSArg> *)__begin1);
  do {
    if (__end1 == pls) {
      return __return_storage_ptr__;
    }
    pPStack_50 = __end1;
    __range2._7_1_ = 0;
    __begin2 = (Resource *)secondary_resources_local;
    __end2 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                       (&secondary_resources_local->super_VectorView<spirv_cross::Resource>);
    res = spirv_cross::VectorView<spirv_cross::Resource>::end
                    ((VectorView<spirv_cross::Resource> *)__begin2);
    for (; __end2 != res; __end2 = __end2 + 1) {
      local_78 = __end2;
      _Var1 = std::operator==(&__end2->name,&pPStack_50->name);
      if (_Var1) {
        local_80.id = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)local_78);
        local_80.format = pPStack_50->format;
        std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::push_back
                  (__return_storage_ptr__,&local_80);
        __range2._7_1_ = 1;
        break;
      }
    }
    if (((__range2._7_1_ & 1) == 0) && (local_28 != (SmallVector<spirv_cross::Resource,_8UL> *)0x0))
    {
      __begin3 = (Resource *)local_28;
      __end3 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                         (&local_28->super_VectorView<spirv_cross::Resource>);
      res_1 = spirv_cross::VectorView<spirv_cross::Resource>::end
                        ((VectorView<spirv_cross::Resource> *)__begin3);
      for (; __end3 != res_1; __end3 = __end3 + 1) {
        local_b0 = __end3;
        _Var1 = std::operator==(&__end3->name,&pPStack_50->name);
        if (_Var1) {
          local_b8.id = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)local_b0);
          local_b8.format = pPStack_50->format;
          std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::push_back
                    (__return_storage_ptr__,&local_b8);
          __range2._7_1_ = 1;
          break;
        }
      }
    }
    __stream = _stderr;
    if ((__range2._7_1_ & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      fprintf(__stream,"Did not find stage input/output/target with name \"%s\".\n",uVar2);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static vector<PlsRemap> remap_pls(const SmallVector<PLSArg> &pls_variables, const SmallVector<Resource> &resources,
                                  const SmallVector<Resource> *secondary_resources)
{
	vector<PlsRemap> ret;

	for (auto &pls : pls_variables)
	{
		bool found = false;
		for (auto &res : resources)
		{
			if (res.name == pls.name)
			{
				ret.push_back({ res.id, pls.format });
				found = true;
				break;
			}
		}

		if (!found && secondary_resources)
		{
			for (auto &res : *secondary_resources)
			{
				if (res.name == pls.name)
				{
					ret.push_back({ res.id, pls.format });
					found = true;
					break;
				}
			}
		}

		if (!found)
			fprintf(stderr, "Did not find stage input/output/target with name \"%s\".\n", pls.name.c_str());
	}

	return ret;
}